

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.h
# Opt level: O3

Entity * __thiscall
lf::assemble::DynamicFEDofHandler::Entity(DynamicFEDofHandler *this,gdof_idx_t dofnum)

{
  pointer ppEVar1;
  ostream *poVar2;
  runtime_error *this_00;
  stringstream ss;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  ppEVar1 = (this->dof_entities_).
            super__Vector_base<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)dofnum <
      (ulong)((long)(this->dof_entities_).
                    super__Vector_base<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3)) {
    return ppEVar1[dofnum];
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Illegal dof index ",0x12);
  poVar2 = std::ostream::_M_insert<long>((long)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", max = ",8);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e0,"dofnum < dof_entities_.size()","");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_1e0,&local_200,0x2f1,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[nodiscard]] const lf::mesh::Entity &Entity(
      gdof_idx_t dofnum) const override {
    LF_VERIFY_MSG(dofnum < dof_entities_.size(),
                  "Illegal dof index " << dofnum << ", max = " << num_dof_);
    return *dof_entities_[dofnum];
  }